

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes
          (ConversionStream *this)

{
  TokenListType *this_00;
  int iVar1;
  HLSL2GLSLConverterImpl *pHVar2;
  iterator __position;
  uint uVar3;
  __node_base_ptr p_Var4;
  _List_node_base *p_Var5;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var6;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  string err;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_90;
  uint local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_5c;
  ConversionStream *local_58;
  String local_50;
  
  this_00 = &this->m_Tokens;
  _Var6._M_node =
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_5c = *(int *)&_Var6._M_node[1]._M_next;
  if (local_5c == 0x133) {
    _Var6._M_node = (_Var6._M_node)->_M_next;
  }
  uVar8 = (uint)(local_5c == 0x133);
  uVar10 = uVar8;
  uVar9 = uVar8;
  uVar3 = local_84;
  while (local_84 = uVar9, p_Var5 = (_List_node_base *)this_00, uVar9 = uVar10,
        local_90._M_node = _Var6._M_node, _Var6._M_node != (_List_node_base *)this_00) {
    iVar1 = *(int *)&_Var6._M_node[1]._M_next;
    if (iVar1 == 0x134) {
      uVar9 = uVar10 - 1;
      p_Var5 = _Var6._M_node;
      uVar3 = local_84;
      if ((int)uVar10 <= (int)uVar8) break;
LAB_0038f429:
      _Var6._M_node = (local_90._M_node)->_M_next;
      uVar10 = uVar9;
      uVar9 = local_84;
      uVar3 = local_84;
    }
    else {
      if (iVar1 == 0x133) {
        uVar9 = uVar10 + 1;
        goto LAB_0038f429;
      }
      if ((uVar10 != 0) || (iVar1 != 0x137)) goto LAB_0038f429;
      local_90._M_node = (_Var6._M_node)->_M_next;
      if (local_90._M_node == (_List_node_base *)this_00) {
LAB_0038f4d8:
        uVar10 = 0;
        _Var6._M_node = local_90._M_node;
        uVar9 = local_84;
        uVar3 = local_84;
      }
      else {
        pHVar2 = this->m_Converter;
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&local_80,(Char *)local_90._M_node[1]._M_prev,false);
        p_Var4 = std::
                 _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::_M_find_before_node
                           (&(pHVar2->m_SpecialShaderAttributes)._M_h,
                            (local_80._M_string_length & 0x7fffffffffffffff) %
                            (pHVar2->m_SpecialShaderAttributes)._M_h._M_bucket_count,
                            (key_type *)&local_80,local_80._M_string_length & 0x7fffffffffffffff);
        if (p_Var4 == (__node_base_ptr)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = p_Var4->_M_nxt == (_Hash_node_base *)0x0;
        }
        if ((local_80._M_dataplus._M_p != (Char *)0x0) && ((long)local_80._M_string_length < 0)) {
          operator_delete__(local_80._M_dataplus._M_p);
        }
        uVar8 = local_84;
        uVar9 = 0;
        if (bVar11) goto LAB_0038f429;
        if (local_90._M_node != (_List_node_base *)this_00) {
          iVar1 = *(int *)&local_90._M_node[1]._M_next;
          while ((iVar1 != 0x138 &&
                 (local_90._M_node = (local_90._M_node)->_M_next,
                 local_90._M_node != (_List_node_base *)this_00))) {
            iVar1 = *(int *)&local_90._M_node[1]._M_next;
          }
        }
        uVar10 = 0;
        if (local_90._M_node == (_List_node_base *)this_00) goto LAB_0038f4d8;
        local_90._M_node = (local_90._M_node)->_M_next;
        local_58 = this;
        __position._M_node = _Var6._M_node;
        _Var7._M_node = (_List_node_base *)this_00;
        if (local_90._M_node != (_List_node_base *)this_00) {
          std::operator+(&local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &_Var6._M_node[3]._M_prev,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90._M_node[3]._M_prev);
          std::__cxx11::string::operator=
                    ((string *)&local_90._M_node[3]._M_prev,(string *)&local_80);
          _Var7._M_node = local_90._M_node;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            _Var7._M_node = local_90._M_node;
          }
        }
        while (this = local_58, _Var6._M_node = local_90._M_node, uVar9 = local_84, uVar3 = local_84
              , _Var7._M_node != __position._M_node) {
          p_Var5 = (__position._M_node)->_M_next;
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::_M_erase(this_00,__position);
          __position._M_node = p_Var5;
        }
      }
    }
  }
  local_84 = uVar3;
  if (local_5c == 0x133) {
    if (p_Var5 == (_List_node_base *)this_00) {
      FormatString<char[38]>(&local_80,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_50,this,&local_90,4);
      p_Var5 = (_List_node_base *)0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,&local_80,(char (*) [2])0x82ea05,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(int *)&local_90._M_node[1]._M_next == 0x134) {
      return;
    }
    FormatString<char[26],char[32]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",(char (*) [32])p_Var5);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (uVar9 == 0) {
      return;
    }
    FormatString<char[20]>(&local_80,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_50,this,&local_90,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,&local_80,(char (*) [2])0x82ea05,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes()
{
    auto ScopeStartToken = m_Tokens.begin();
    ProcessScope(
        ScopeStartToken, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& Token, int ScopeDepth) //
        {
            // Search global scope only
            if (ScopeDepth != 0 || Token->Type != TokenType::OpenSquareBracket)
            {
                ++Token;
                return;
            }

            // [numthreads(16, 16, 1)]
            // ^
            auto OpenStaple = Token;
            ++Token;
            if (Token == m_Tokens.end())
                return;
            // [numthreads(16, 16, 1)]
            //  ^
            if (m_Converter.m_SpecialShaderAttributes.find(Token->Literal.c_str()) != m_Converter.m_SpecialShaderAttributes.end())
            {
                while (Token != m_Tokens.end() && Token->Type != TokenType::ClosingSquareBracket)
                    ++Token;
                // [numthreads(16, 16, 1)]
                //                       ^
                if (Token == m_Tokens.end())
                    return;
                ++Token;
                // [numthreads(16, 16, 1)]
                // void CS(uint3 ThreadId  : SV_DispatchThreadID)
                // ^
                if (Token != m_Tokens.end())
                    Token->Delimiter = OpenStaple->Delimiter + Token->Delimiter;
                m_Tokens.erase(OpenStaple, Token);
            }
            else
                ++Token;
        } //
    );
}